

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_grasshopper_cipher.c
# Opt level: O0

int gost_grasshopper_cipher_do_ecb(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  grasshopper_w128_t *source;
  ulong in_RCX;
  grasshopper_w128_t *in_RSI;
  undefined8 in_RDI;
  size_t i;
  size_t blocks;
  uchar *current_out;
  uchar *current_in;
  _Bool encrypting;
  gost_grasshopper_cipher_ctx *c;
  grasshopper_w128_t *in_stack_ffffffffffffffa8;
  grasshopper_w128_t *target;
  
  EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
  source = (grasshopper_w128_t *)(in_RCX >> 4);
  for (target = (grasshopper_w128_t *)0x0; target < source;
      target = (grasshopper_w128_t *)(target->b + 1)) {
    if (iVar1 == 0) {
      grasshopper_decrypt_block
                ((grasshopper_round_keys_t *)in_RSI,source,target,in_stack_ffffffffffffffa8);
    }
    else {
      grasshopper_encrypt_block
                ((grasshopper_round_keys_t *)in_RSI,source,target,in_stack_ffffffffffffffa8);
    }
    in_RSI = in_RSI + 1;
  }
  return 1;
}

Assistant:

static int gost_grasshopper_cipher_do_ecb(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                          const unsigned char *in, size_t inl)
{
    gost_grasshopper_cipher_ctx *c =
        (gost_grasshopper_cipher_ctx *) EVP_CIPHER_CTX_get_cipher_data(ctx);
    bool encrypting = (bool) EVP_CIPHER_CTX_encrypting(ctx);
    const unsigned char *current_in = in;
    unsigned char *current_out = out;
    size_t blocks = inl / GRASSHOPPER_BLOCK_SIZE;
    size_t i;

    for (i = 0; i < blocks;
         i++, current_in += GRASSHOPPER_BLOCK_SIZE, current_out +=
         GRASSHOPPER_BLOCK_SIZE) {
        if (encrypting) {
            grasshopper_encrypt_block(&c->encrypt_round_keys,
                                      (grasshopper_w128_t *) current_in,
                                      (grasshopper_w128_t *) current_out,
                                      &c->buffer);
        } else {
            grasshopper_decrypt_block(&c->decrypt_round_keys,
                                      (grasshopper_w128_t *) current_in,
                                      (grasshopper_w128_t *) current_out,
                                      &c->buffer);
        }
    }

    return 1;
}